

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Frame.cpp
# Opt level: O0

void __thiscall IRT::CFrame::CFrame(CFrame *this,string *_className,string *_methodName)

{
  CAddressInRegister *pCVar1;
  string local_f8 [32];
  CTemp local_d8;
  undefined1 local_b1;
  string local_b0 [32];
  CTemp local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [48];
  string *local_20;
  string *_methodName_local;
  string *_className_local;
  CFrame *this_local;
  
  local_20 = (string *)_methodName;
  _methodName_local = _className;
  _className_local = &this->className;
  std::__cxx11::string::string((string *)this,(string *)_className);
  std::__cxx11::string::string((string *)&this->methodName,local_20);
  std::operator+(local_70,(char *)this);
  std::operator+(local_50,local_70);
  CLabel::CLabel(&this->name,local_50);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)local_70);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::IAddress,_std::default_delete<const_IRT::IAddress>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::IAddress,_std::default_delete<const_IRT::IAddress>_>_>_>_>
  ::unordered_map(&this->localVisibilityAddresses);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::IAddress,_std::default_delete<const_IRT::IAddress>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::IAddress,_std::default_delete<const_IRT::IAddress>_>_>_>_>
  ::unordered_map(&this->classFieldAddresses);
  this->maxOffsetFramePointer = 0;
  this->maxOffsetThis = 0;
  pCVar1 = (CAddressInRegister *)operator_new(0x28);
  local_b1 = 1;
  std::__cxx11::string::string(local_b0,(string *)framePointerAddressName_abi_cxx11_);
  CTemp::CTemp(&local_90,(string *)local_b0);
  CAddressInRegister::CAddressInRegister(pCVar1,&local_90);
  local_b1 = 0;
  addAddress(this,(string *)framePointerAddressName_abi_cxx11_,(IAddress *)pCVar1);
  CTemp::~CTemp(&local_90);
  std::__cxx11::string::~string(local_b0);
  pCVar1 = (CAddressInRegister *)operator_new(0x28);
  std::__cxx11::string::string(local_f8,(string *)returnValueAddressName_abi_cxx11_);
  CTemp::CTemp(&local_d8,(string *)local_f8);
  CAddressInRegister::CAddressInRegister(pCVar1,&local_d8);
  addAddress(this,(string *)returnValueAddressName_abi_cxx11_,(IAddress *)pCVar1);
  CTemp::~CTemp(&local_d8);
  std::__cxx11::string::~string(local_f8);
  return;
}

Assistant:

CFrame::CFrame(const std::string &_className, const std::string &_methodName)
        : className(_className), methodName(_methodName), name(className + "$" + methodName),
          maxOffsetFramePointer(0), maxOffsetThis(0) {
    addAddress(framePointerAddressName, new CAddressInRegister(CTemp(framePointerAddressName)));
    addAddress(returnValueAddressName, new CAddressInRegister(CTemp(returnValueAddressName)));
}